

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_expr.cpp
# Opt level: O3

void __thiscall Omega_h::CallOp::CallOp(CallOp *this,string *name_in,Args *args_in)

{
  pointer pcVar1;
  pointer paVar2;
  bool bVar3;
  undefined8 *puVar4;
  size_type __n;
  pointer this_00;
  OpPtr op;
  value_type local_48;
  string *local_38;
  
  (this->super_ExprOp)._vptr_ExprOp = (_func_int **)&PTR__CallOp_004b8b68;
  local_38 = &this->name;
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (name_in->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_38,pcVar1,pcVar1 + name_in->_M_string_length);
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->args).super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rhs).
  super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = (args_in->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
            super__Vector_impl_data._M_start;
  paVar2 = (args_in->super__Vector_base<Omega_h::any,_std::allocator<Omega_h::any>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (this_00 == paVar2) {
    __n = 0;
  }
  else {
    do {
      bVar3 = any::is_typed(this_00,(type_info *)&std::shared_ptr<Omega_h::ExprOp>::typeinfo);
      if (!bVar3) {
        puVar4 = (undefined8 *)__cxa_allocate_exception(8);
        *puVar4 = &PTR__bad_cast_004b86a8;
        __cxa_throw(puVar4,&bad_any_cast::typeinfo,std::bad_cast::~bad_cast);
      }
      local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(this_00->storage).dynamic;
      local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)&this_00->storage + 8);
      if (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi)->_M_use_count =
               (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi)->_M_use_count + 1;
        }
      }
      std::
      vector<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>::
      push_back(&this->rhs,&local_48);
      if (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_48.super___shared_ptr<Omega_h::ExprOp,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      this_00 = this_00 + 1;
    } while (this_00 != paVar2);
    __n = (long)(this->rhs).
                super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->rhs).
                super__Vector_base<std::shared_ptr<Omega_h::ExprOp>,_std::allocator<std::shared_ptr<Omega_h::ExprOp>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 4;
  }
  std::vector<Omega_h::any,_std::allocator<Omega_h::any>_>::reserve(&this->args,__n);
  return;
}

Assistant:

CallOp(std::string const& name_in, ExprEnv::Args const& args_in)
      : name(name_in) {
    for (auto& arg : args_in) {
      OpPtr op = any_cast<OpPtr>(arg);
      rhs.push_back(op);
    }
    args.reserve(rhs.size());
  }